

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O2

void __thiscall TCPConnection::TCPConnection(TCPConnection *this)

{
  this->RxInOffset = 0;
  this->RxOutOffset = 0;
  this->TxOffset = 0;
  this->CurrentWindow = 0x100;
  this->TxBuffer = (DataBuffer *)0x0;
  this->RxBufferEmpty = true;
  this->NewConnection = (TCPConnection *)0x0;
  this->Parent = (TCPConnection *)0x0;
  osEvent::osEvent(&this->Event,"tcp connection");
  osQueue::osQueue(&this->HoldingQueue,"TCPHolding",0x14,this->ConnectionHoldingBuffer);
  osMutex::osMutex(&this->HoldingQueueLock,"HoldingQueueLock");
  this->MAC = (InterfaceMAC *)0x0;
  this->IP = (ProtocolIPv4 *)0x0;
  this->TCP = (ProtocolTCP *)0x0;
  return;
}

Assistant:

TCPConnection::TCPConnection()
    : RxInOffset(0)
    , RxOutOffset(0)
    , TxOffset(0)
    , CurrentWindow(TCP_RX_WINDOW_SIZE)
    , TxBuffer(nullptr)
    , RxBufferEmpty(true)
    , NewConnection(nullptr)
    , Parent(nullptr)
    , Event("tcp connection")
    , HoldingQueue("TCPHolding", TX_BUFFER_COUNT, ConnectionHoldingBuffer)
    , HoldingQueueLock("HoldingQueueLock")
    , MAC(nullptr)
    , IP(nullptr)
    , TCP(nullptr)
{
}